

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::counterBufferType(HlslParseContext *this,TSourceLoc *loc,TType *type)

{
  char *__s;
  int iVar1;
  TType *this_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  undefined4 extraout_var;
  TType *this_02;
  pool_allocator<char> local_118;
  TString local_110;
  TTypeLoc member;
  TType blockType;
  
  this_00 = (TType *)TType::operator_new((TType *)0x98,(size_t)loc);
  TType::TType(this_00,EbtUint,EvqBuffer,1,0,0,false);
  __s = ((this->super_TParseContextBase).super_TParseVersions.intermediate)->implicitCounterName;
  local_110._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  this_02 = &blockType;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_02,__s,
             (pool_allocator<char> *)&local_110);
  (*this_00->_vptr_TType[4])(this_00);
  this_01 = (vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
            TVector<glslang::TTypeLoc>::operator_new
                      ((TVector<glslang::TTypeLoc> *)0x20,(size_t)this_02);
  TVector<glslang::TTypeLoc>::TVector((TVector<glslang::TTypeLoc> *)this_01);
  member.loc.name = loc->name;
  member.loc.string = loc->string;
  member.loc.line = loc->line;
  member.loc.column = loc->column;
  member.loc._20_4_ = *(undefined4 *)&loc->field_0x14;
  member.type = this_00;
  std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
            (this_01,&member);
  local_118.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_110,
             "",&local_118);
  iVar1 = (*this_00->_vptr_TType[10])(this_00);
  TType::TType(&blockType,(TTypeList *)this_01,&local_110,(TQualifier *)CONCAT44(extraout_var,iVar1)
              );
  blockType.qualifier._8_8_ = blockType.qualifier._8_8_ & 0xffffffffffffff80 | 6;
  TType::shallowCopy(type,&blockType);
  shareStructBufferType(this,type);
  return;
}

Assistant:

void HlslParseContext::counterBufferType(const TSourceLoc& loc, TType& type)
{
    // Counter type
    TType* counterType = new TType(EbtUint, EvqBuffer);
    counterType->setFieldName(intermediate.implicitCounterName);

    TTypeList* blockStruct = new TTypeList;
    TTypeLoc  member = { counterType, loc };
    blockStruct->push_back(member);

    TType blockType(blockStruct, "", counterType->getQualifier());
    blockType.getQualifier().storage = EvqBuffer;

    type.shallowCopy(blockType);
    shareStructBufferType(type);
}